

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::ChLinkUniversal(ChLinkUniversal *this,ChLinkUniversal *other)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ChQuaternion<double> local_50;
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkUniversal_00b459e8;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  (this->m_frame1)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->m_frame1).coord.pos.m_data[0] = 0.0;
  (this->m_frame1).coord.pos.m_data[1] = 0.0;
  (this->m_frame1).coord.pos.m_data[2] = 0.0;
  (this->m_frame1).coord.rot.m_data[0] = 1.0;
  (this->m_frame1).coord.rot.m_data[1] = 0.0;
  (this->m_frame1).coord.rot.m_data[2] = 0.0;
  (this->m_frame1).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_frame1).Amatrix,&local_50);
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 0.0;
  local_50.m_data[2] = 0.0;
  local_50.m_data[3] = 0.0;
  (this->m_frame2)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->m_frame2).coord.pos.m_data[0] = 0.0;
  (this->m_frame2).coord.pos.m_data[1] = 0.0;
  (this->m_frame2).coord.pos.m_data[2] = 0.0;
  (this->m_frame2).coord.rot.m_data[0] = 1.0;
  (this->m_frame2).coord.rot.m_data[1] = 0.0;
  (this->m_frame2).coord.rot.m_data[2] = 0.0;
  (this->m_frame2).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->m_frame2).Amatrix,&local_50);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_x);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_y);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_z);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_dot);
  (this->super_ChLink).Body1 = (other->super_ChLink).Body1;
  (this->super_ChLink).Body2 = (other->super_ChLink).Body2;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system =
       (other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.system;
  ChFrame<double>::operator=(&this->m_frame1,&other->m_frame1);
  ChFrame<double>::operator=(&this->m_frame2,&other->m_frame2);
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_x,(ChVariables *)CONCAT44(extraout_var,iVar1),
             (ChVariables *)CONCAT44(extraout_var_00,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_y,(ChVariables *)CONCAT44(extraout_var_01,iVar1),
             (ChVariables *)CONCAT44(extraout_var_02,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_z,(ChVariables *)CONCAT44(extraout_var_03,iVar1),
             (ChVariables *)CONCAT44(extraout_var_04,iVar2));
  iVar1 = (*(((other->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar2 = (*(((other->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_05,iVar1),
             (ChVariables *)CONCAT44(extraout_var_06,iVar2));
  this->m_multipliers[0] = other->m_multipliers[0];
  this->m_multipliers[1] = other->m_multipliers[1];
  this->m_multipliers[2] = other->m_multipliers[2];
  this->m_multipliers[3] = other->m_multipliers[3];
  return;
}

Assistant:

ChLinkUniversal::ChLinkUniversal(const ChLinkUniversal& other) : ChLink(other) {
    Body1 = other.Body1;
    Body2 = other.Body2;
    system = other.system;

    m_frame1 = other.m_frame1;
    m_frame2 = other.m_frame2;

    m_cnstr_x.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_y.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_z.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());
    m_cnstr_dot.SetVariables(&other.Body1->Variables(), &other.Body2->Variables());

    m_multipliers[0] = other.m_multipliers[0];
    m_multipliers[1] = other.m_multipliers[1];
    m_multipliers[2] = other.m_multipliers[2];
    m_multipliers[3] = other.m_multipliers[3];
}